

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

cram_record * cram_get_seq(cram_fd *fd)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  cram_block_slice_hdr *pcVar3;
  cram_record *pcVar4;
  cram_slice *pcVar5;
  int iVar6;
  cram_container *c;
  cram_block *pcVar7;
  cram_block_compression_hdr *pcVar8;
  t_pool_result *r;
  void *pvVar9;
  cram_slice *pcVar10;
  
  __mutex = &fd->ref_lock;
LAB_0011f21f:
  c = fd->ctr;
  if (c == (cram_container *)0x0) {
    do {
      c = cram_read_container(fd);
      fd->ctr = c;
      if (c == (cram_container *)0x0) {
        return (cram_record *)0x0;
      }
      iVar6 = c->length;
    } while (iVar6 == 0);
    if ((fd->range).refid != -2) {
      while (iVar2 = c->ref_seq_id, iVar2 != -2) {
        iVar1 = (fd->range).refid;
        if ((iVar1 <= iVar2) && ((fd->range).start < c->ref_seq_span + c->ref_seq_start)) {
          if (iVar2 != iVar1) {
            return (cram_record *)0x0;
          }
          break;
        }
        iVar6 = cram_seek(fd,(long)iVar6,1);
        if (iVar6 != 0) {
          return (cram_record *)0x0;
        }
        cram_free_container(fd->ctr);
        do {
          c = cram_read_container(fd);
          fd->ctr = c;
          if (c == (cram_container *)0x0) {
            return (cram_record *)0x0;
          }
          iVar6 = c->length;
        } while (iVar6 == 0);
      }
    }
    pcVar7 = cram_read_block(fd);
    c->comp_hdr_block = pcVar7;
    if (pcVar7 == (cram_block *)0x0) {
      return (cram_record *)0x0;
    }
    if (pcVar7->content_type != COMPRESSION_HEADER) {
      return (cram_record *)0x0;
    }
    pcVar8 = cram_decode_compression_header(fd,pcVar7);
    c->comp_hdr = pcVar8;
    if (pcVar8 == (cram_block_compression_hdr *)0x0) {
      return (cram_record *)0x0;
    }
    if (pcVar8->AP_delta == 0) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      fd->unsorted = 1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
LAB_0011f2cd:
    pcVar10 = c->slice;
    if (pcVar10 != (cram_slice *)0x0) {
      c->slice = (cram_slice *)0x0;
      cram_free_slice(pcVar10);
    }
    pcVar10 = (cram_slice *)0x0;
    pcVar5 = (cram_slice *)0x0;
    if (c->curr_slice != c->max_slice) goto LAB_0011f30f;
LAB_0011f2fe:
    cram_free_container(c);
    c = (cram_container *)0x0;
    pcVar5 = pcVar10;
LAB_0011f30f:
    do {
      pcVar10 = pcVar5;
      pvVar9 = fd->job_pending;
LAB_0011f316:
      if (pvVar9 == (void *)0x0) {
        if (fd->ooc == 0) {
          do {
            if ((c == (cram_container *)0x0) || (c->curr_slice == c->max_slice)) {
              do {
                c = cram_read_container(fd);
                fd->ctr = c;
                if (c == (cram_container *)0x0) {
                  if (fd->pool == (t_pool *)0x0) {
                    return (cram_record *)0x0;
                  }
                  fd->ooc = 1;
                  goto LAB_0011f57b;
                }
                iVar6 = c->length;
              } while ((long)iVar6 == 0);
              if (fd->ooc != 0) goto LAB_0011f6ac;
              iVar2 = (fd->range).refid;
              if ((iVar2 != -2) && (iVar1 = c->ref_seq_id, iVar1 != -2)) {
                *(byte *)&fd->required_fields = (byte)fd->required_fields | 8;
                if ((iVar1 != iVar2) || ((fd->range).end < c->ref_seq_start)) {
                  cram_free_container(c);
                  fd->ctr = (cram_container *)0x0;
                  fd->ooc = 1;
                  fd->eof = 1;
                  goto LAB_0011f6ac;
                }
                if (c->ref_seq_start + c->ref_seq_span <= (fd->range).start) goto LAB_0011f41d;
              }
              pcVar7 = cram_read_block(fd);
              c->comp_hdr_block = pcVar7;
              if (pcVar7 == (cram_block *)0x0) {
                return (cram_record *)0x0;
              }
              if (pcVar7->content_type != COMPRESSION_HEADER) {
                return (cram_record *)0x0;
              }
              pcVar8 = cram_decode_compression_header(fd,pcVar7);
              c->comp_hdr = pcVar8;
              if (pcVar8 == (cram_block_compression_hdr *)0x0) {
                return (cram_record *)0x0;
              }
              if (pcVar8->AP_delta == 0) {
                pthread_mutex_lock((pthread_mutex_t *)__mutex);
                fd->unsorted = 1;
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              }
            }
            if (c->num_records != 0) {
              pcVar10 = cram_read_slice(fd);
              c->slice = pcVar10;
              if (pcVar10 == (cram_slice *)0x0) {
                return (cram_record *)0x0;
              }
              c->curr_slice = c->curr_slice + 1;
              c->curr_rec = 0;
              pcVar3 = pcVar10->hdr;
              c->max_rec = pcVar3->num_records;
              iVar6 = pcVar3->ref_seq_start;
              pcVar10->last_apos = iVar6;
              iVar2 = (fd->range).refid;
              if ((iVar2 == -2) || (pcVar3->ref_seq_id == -2)) break;
              if ((pcVar3->ref_seq_id != iVar2) || ((fd->range).end < iVar6)) goto LAB_0011f6f1;
              if ((fd->range).start < iVar6 + pcVar3->ref_seq_span) break;
              cram_free_slice(pcVar10);
              c->slice = (cram_slice *)0x0;
              goto LAB_0011f2fe;
            }
            cram_free_container(c);
            c = (cram_container *)0x0;
          } while( true );
        }
      }
      else {
        c = *(cram_container **)((long)pvVar9 + 8);
        pcVar10 = *(cram_slice **)((long)pvVar9 + 0x10);
        free(pvVar9);
        fd->job_pending = (void *)0x0;
      }
      if ((c == (cram_container *)0x0) || (pcVar10 == (cram_slice *)0x0)) goto LAB_0011f6ac;
      iVar6 = cram_decode_slice_mt(fd,c,pcVar10,fd->header);
      if (iVar6 != 0) {
        cram_get_seq_cold_1();
        return (cram_record *)0x0;
      }
      if (fd->pool == (t_pool *)0x0) goto LAB_0011f5d3;
      if ((fd->job_pending != (void *)0x0) ||
         (iVar6 = t_pool_results_queue_len(fd->rqueue), pcVar5 = pcVar10, fd->pool->qsize < iVar6))
      goto LAB_0011f6ba;
    } while( true );
  }
  pcVar10 = c->slice;
  if ((pcVar10 == (cram_slice *)0x0) || (c->max_rec <= c->curr_rec)) goto LAB_0011f2cd;
  goto LAB_0011f5d3;
LAB_0011f41d:
  c->curr_rec = c->max_rec;
  c->curr_slice = c->max_slice;
  cram_seek(fd,(long)iVar6,1);
  cram_free_container(c);
  pvVar9 = fd->job_pending;
  c = (cram_container *)0x0;
  goto LAB_0011f316;
LAB_0011f6ac:
  if (fd->pool != (t_pool *)0x0) {
LAB_0011f6ba:
    if (fd->ooc != 0) {
LAB_0011f57b:
      iVar6 = t_pool_results_queue_empty(fd->rqueue);
      if (iVar6 != 0) {
        return (cram_record *)0x0;
      }
    }
    r = t_pool_next_result_wait(fd->rqueue);
    if ((r == (t_pool_result *)0x0) || (pvVar9 = r->data, pvVar9 == (void *)0x0)) {
      cram_get_seq_cold_2();
      return (cram_record *)0x0;
    }
    c = *(cram_container **)((long)pvVar9 + 8);
    pcVar10 = *(cram_slice **)((long)pvVar9 + 0x10);
    fd->ctr = c;
    t_pool_delete_result(r,1);
  }
  if (pcVar10 == (cram_slice *)0x0) {
    return (cram_record *)0x0;
  }
LAB_0011f5d3:
  iVar6 = (fd->range).refid;
  pcVar4 = pcVar10->crecs;
  iVar2 = c->curr_rec;
  if (iVar6 == -2) {
LAB_0011f6d6:
    fd->ctr = c;
    c->slice = pcVar10;
    c->curr_rec = iVar2 + 1;
    return pcVar4 + iVar2;
  }
  if (iVar6 <= pcVar4[iVar2].ref_id) {
    if ((pcVar4[iVar2].ref_id != iVar6) || ((fd->range).end < pcVar4[iVar2].apos)) {
LAB_0011f6f1:
      fd->eof = 1;
      cram_free_slice(pcVar10);
      c->slice = (cram_slice *)0x0;
      return (cram_record *)0x0;
    }
    if ((fd->range).start <= pcVar4[iVar2].aend) goto LAB_0011f6d6;
  }
  c->curr_rec = iVar2 + 1;
  goto LAB_0011f21f;
}

Assistant:

cram_record *cram_get_seq(cram_fd *fd) {
    cram_container *c;
    cram_slice *s;

    for (;;) {
	c = fd->ctr;
	if (c && c->slice && c->curr_rec < c->max_rec) {
	    s = c->slice;
	} else {
	    if (!(s = cram_next_slice(fd, &c)))
		return NULL;
	}

	if (fd->range.refid != -2) {
	    if (s->crecs[c->curr_rec].ref_id < fd->range.refid) {
		c->curr_rec++;
		continue;
	    }

	    if (s->crecs[c->curr_rec].ref_id != fd->range.refid) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].apos > fd->range.end) {
		fd->eof = 1;
		cram_free_slice(s);
		c->slice = NULL;
		return NULL;
	    }

	    if (s->crecs[c->curr_rec].aend < fd->range.start) {
		c->curr_rec++;
		continue;
	    }
	}

	break;
    }

    fd->ctr = c;
    c->slice = s;
    return &s->crecs[c->curr_rec++];
}